

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_send_op.hpp
# Opt level: O0

void __thiscall
asio::detail::reactive_socket_send_op_base<asio::const_buffers_1>::reactive_socket_send_op_base
          (reactive_socket_send_op_base<asio::const_buffers_1> *this,error_code *success_ec,
          socket_type socket,state_type state,const_buffers_1 *buffers,message_flags flags,
          func_type complete_func)

{
  code in_CL;
  undefined4 in_EDX;
  perform_func_type in_RDI;
  reactor_op *in_R8;
  undefined4 in_R9D;
  func_type in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  
  reactor_op::reactor_op
            (in_R8,(error_code *)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),in_RDI,
             in_stack_ffffffffffffffc8);
  *(undefined4 *)(in_RDI + 0x40) = in_EDX;
  in_RDI[0x44] = in_CL;
  *(scheduler_operation **)(in_RDI + 0x48) = (in_R8->super_operation).next_;
  *(func_type *)(in_RDI + 0x50) = (in_R8->super_operation).func_;
  *(undefined4 *)(in_RDI + 0x58) = in_R9D;
  return;
}

Assistant:

reactive_socket_send_op_base(const asio::error_code& success_ec,
      socket_type socket, socket_ops::state_type state,
      const ConstBufferSequence& buffers,
      socket_base::message_flags flags, func_type complete_func)
    : reactor_op(success_ec,
        &reactive_socket_send_op_base::do_perform, complete_func),
      socket_(socket),
      state_(state),
      buffers_(buffers),
      flags_(flags)
  {
  }